

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O3

bool __thiscall
cmCursesStringWidget::HandleInput
          (cmCursesStringWidget *this,int *key,cmCursesMainForm *fm,WINDOW *w)

{
  char cVar1;
  FORM *form;
  FIELD *field;
  FIELD *pFVar2;
  int iVar3;
  bool bVar4;
  char debugMessage [128];
  char local_b8 [136];
  
  form = (fm->super_cmCursesForm).Form;
  if (((((this->super_cmCursesWidget).field_0x3c == '\0') && (iVar3 = *key, iVar3 != 10)) &&
      (iVar3 != 0x157)) && (iVar3 != 0x69)) {
LAB_0015c3b8:
    bVar4 = false;
  }
  else {
    (this->OriginalString)._M_string_length = 0;
    *(this->OriginalString)._M_dataplus._M_p = '\0';
    this->Done = false;
    do {
      snprintf(local_b8,0x80,"String widget handling input, key: %d",(ulong)(uint)*key);
      cmCursesForm::LogMessage(local_b8);
      cmCursesMainForm::PrintKeys(fm,0);
      if (((_stdscr == 0) || (*(short *)(_stdscr + 6) < 0x40)) || (*(short *)(_stdscr + 4) < 5)) {
        if (*key != 0x71) goto LAB_0015c1e1;
        goto LAB_0015c3b8;
      }
      cVar1 = (this->super_cmCursesWidget).field_0x3c;
      iVar3 = *key;
      if (cVar1 == '\0') {
        if (iVar3 != 10) {
          if (iVar3 == 0x69) goto LAB_0015c20c;
          if (iVar3 != 0x157) goto LAB_0015c3b8;
        }
LAB_0015c24a:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[8])(this,fm,w);
        goto LAB_0015c259;
      }
      if ((iVar3 == 10) || (iVar3 == 0x157)) goto LAB_0015c24a;
LAB_0015c20c:
      if (iVar3 == 0x69 && cVar1 == '\0') goto LAB_0015c24a;
      if (0x101 < iVar3) {
        if (iVar3 < 0x14a) {
          switch(iVar3) {
          case 0x102:
          case 0x103:
            goto switchD_0015c237_caseD_4;
          case 0x104:
            goto switchD_0015c237_caseD_2;
          case 0x105:
            goto switchD_0015c237_caseD_6;
          case 0x106:
            goto switchD_0015c237_caseD_1;
          case 0x107:
            goto switchD_0015c2b5_caseD_107;
          }
        }
        else {
          if (iVar3 == 0x14a) {
            iVar3 = 0x221;
            goto LAB_0015c36c;
          }
          if (iVar3 == 0x168) goto switchD_0015c237_caseD_5;
          if (iVar3 - 0x152U < 2) goto switchD_0015c237_caseD_4;
        }
switchD_0015c237_caseD_3:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[9])(this,key,fm,w);
        goto LAB_0015c259;
      }
      switch(iVar3) {
      case 1:
switchD_0015c237_caseD_1:
        iVar3 = 0x216;
        break;
      case 2:
switchD_0015c237_caseD_2:
        iVar3 = 0x211;
        break;
      case 3:
      case 7:
      case 8:
      case 10:
      case 0xc:
      case 0xd:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
        goto switchD_0015c237_caseD_3;
      case 4:
      case 0xe:
      case 0x10:
      case 0x15:
switchD_0015c237_caseD_4:
        (this->super_cmCursesWidget).field_0x3c = 0;
        (this->OriginalString)._M_string_length = 0;
        *(this->OriginalString)._M_dataplus._M_p = '\0';
        form_driver(form,0x204);
        form_driver(form,0x205);
        return false;
      case 5:
switchD_0015c237_caseD_5:
        iVar3 = 0x217;
        break;
      case 6:
switchD_0015c237_caseD_6:
        iVar3 = 0x210;
        break;
      case 9:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[7])(this,fm,w);
        goto LAB_0015c259;
      case 0xb:
        iVar3 = 0x225;
        break;
      case 0x1b:
        if (cVar1 == '\0') goto LAB_0015c259;
        (this->super_cmCursesWidget).field_0x3c = 0;
        cmCursesMainForm::PrintKeys(fm,0);
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,&this->OriginalString);
        (this->OriginalString)._M_string_length = 0;
        *(this->OriginalString)._M_dataplus._M_p = '\0';
        if (w == (WINDOW *)0x0) {
          iVar3 = -1;
        }
        else {
          iVar3 = w->_maxy + 1;
        }
        wtouchln(w,0,iVar3,1);
        wrefresh(w);
        goto LAB_0015c44a;
      default:
        if (iVar3 != 0x7f) goto switchD_0015c237_caseD_3;
switchD_0015c2b5_caseD_107:
        field = current_field(form);
        form_driver(form,0x222);
        pFVar2 = current_field(form);
        if (pFVar2 != field) {
          set_current_field(form,field);
        }
        goto LAB_0015c259;
      }
LAB_0015c36c:
      form_driver(form,iVar3);
LAB_0015c259:
      if (this->Done == false) {
        if (w == (WINDOW *)0x0) {
          iVar3 = -1;
        }
        else {
          iVar3 = w->_maxy + 1;
        }
        wtouchln(w,0,iVar3,1);
        wrefresh(w);
LAB_0015c1e1:
        iVar3 = wgetch(_stdscr);
        *key = iVar3;
      }
    } while (this->Done == false);
LAB_0015c44a:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool cmCursesStringWidget::HandleInput(int& key, cmCursesMainForm* fm,
                                       WINDOW* w)
{
  int x;
  int y;

  FORM* form = fm->GetForm();
  // when not in edit mode, edit mode is entered by pressing enter or i (vim
  // binding)
  // 10 == enter
  if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
    return false;
  }

  this->OriginalString.clear();
  this->Done = false;

  char debugMessage[128];

  // <Enter> is used to change edit mode (like <Esc> in vi).
  while (!this->Done) {
    snprintf(debugMessage, sizeof(debugMessage),
             "String widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    fm->PrintKeys();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        return false;
      }
      key = getch();
      continue;
    }

    // If resize occurred during edit, move out of edit mode
    if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
      return false;
    }
    // toggle edit with return
    if ((key == 10 || key == KEY_ENTER)
        // enter edit with i (and not-edit mode)
        || (!this->InEdit && key == 'i')) {
      this->OnReturn(fm, w);
    } else if (key == KEY_DOWN || key == ctrl('n') || key == KEY_UP ||
               key == ctrl('p') || key == KEY_NPAGE || key == ctrl('d') ||
               key == KEY_PPAGE || key == ctrl('u')) {
      this->InEdit = false;
      this->OriginalString.clear();
      // trick to force forms to update the field buffer
      form_driver(form, REQ_NEXT_FIELD);
      form_driver(form, REQ_PREV_FIELD);
      return false;
    }
    // esc
    else if (key == 27) {
      if (this->InEdit) {
        this->InEdit = false;
        fm->PrintKeys();
        this->SetString(this->OriginalString);
        this->OriginalString.clear();
        touchwin(w);
        wrefresh(w);
        return true;
      }
    } else if (key == 9) {
      this->OnTab(fm, w);
    } else if (key == KEY_LEFT || key == ctrl('b')) {
      form_driver(form, REQ_PREV_CHAR);
    } else if (key == KEY_RIGHT || key == ctrl('f')) {
      form_driver(form, REQ_NEXT_CHAR);
    } else if (key == ctrl('k')) {
      form_driver(form, REQ_CLR_EOL);
    } else if (key == ctrl('a') || key == KEY_HOME) {
      form_driver(form, REQ_BEG_FIELD);
    } else if (key == ctrl('e') || key == KEY_END) {
      form_driver(form, REQ_END_FIELD);
    } else if (key == 127 || key == KEY_BACKSPACE) {
      FIELD* cur = current_field(form);
      form_driver(form, REQ_DEL_PREV);
      if (current_field(form) != cur) {
        set_current_field(form, cur);
      }
    } else if (key == ctrl('d') || key == KEY_DC) {
      form_driver(form, REQ_DEL_CHAR);
    } else {
      this->OnType(key, fm, w);
    }
    if (!this->Done) {
      touchwin(w);
      wrefresh(w);

      key = getch();
    }
  }
  return true;
}